

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::qstring_trait_t>
          ::from_string(wstring *__return_storage_ptr__,
                       parser_info_t<cfgfile::qstring_trait_t> *param_1,string_t *value)

{
  QArrayData *pQVar1;
  longlong lVar2;
  wchar_t wVar3;
  char16_t *pcVar4;
  
  pQVar1 = &((value->m_str).d.d)->super_QArrayData;
  pcVar4 = (value->m_str).d.ptr;
  lVar2 = (value->m_str).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::resize((ulong)__return_storage_ptr__,(wchar_t)lVar2);
  if (pcVar4 == (char16_t *)0x0) {
    pcVar4 = (char16_t *)&QString::_empty;
  }
  wVar3 = QString::toUcs4_helper
                    ((ushort *)pcVar4,lVar2,(uint *)(__return_storage_ptr__->_M_dataplus)._M_p);
  std::__cxx11::wstring::resize((ulong)__return_storage_ptr__,wVar3);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::wstring from_string( const parser_info_t< qstring_trait_t > &,
		const qstring_trait_t::string_t & value )
	{
		return ((QString)value).toStdWString();
	}